

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_value_blob(sqlite3_value *pVal)

{
  long in_RDI;
  Mem *p;
  Mem *in_stack_ffffffffffffffd8;
  undefined4 local_1c;
  undefined8 local_8;
  
  if ((*(ushort *)(in_RDI + 0x14) & 0x12) == 0) {
    local_8 = sqlite3_value_text((sqlite3_value *)0x13ddee);
  }
  else {
    if ((*(ushort *)(in_RDI + 0x14) & 0x400) == 0) {
      local_1c = 0;
    }
    else {
      local_1c = sqlite3VdbeMemExpandBlob(in_stack_ffffffffffffffd8);
    }
    if (local_1c == 0) {
      *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) | 0x10;
      if (*(int *)(in_RDI + 0x10) == 0) {
        local_8 = (uchar *)0x0;
      }
      else {
        local_8 = *(uchar **)(in_RDI + 8);
      }
    }
    else {
      local_8 = (uchar *)0x0;
    }
  }
  return local_8;
}

Assistant:

SQLITE_API const void *sqlite3_value_blob(sqlite3_value *pVal){
  Mem *p = (Mem*)pVal;
  if( p->flags & (MEM_Blob|MEM_Str) ){
    if( ExpandBlob(p)!=SQLITE_OK ){
      assert( p->flags==MEM_Null && p->z==0 );
      return 0;
    }
    p->flags |= MEM_Blob;
    return p->n ? p->z : 0;
  }else{
    return sqlite3_value_text(pVal);
  }
}